

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_dequant,
               Option *opt)

{
  char *pcVar1;
  reference pvVar2;
  float *pfVar3;
  int in_ECX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  Mat *in_stack_00000010;
  vector<float,_std::allocator<float>_> *in_stack_00000018;
  int k_3;
  char *va_3;
  char *vb_3;
  int sum_1;
  int n_5;
  int n_4;
  int n_3;
  int k_2;
  int sum [4];
  char *va_2;
  char *vb_2;
  int j_2;
  float scale_dequant0_1;
  float bias0_1;
  float *output;
  int i_4;
  int k_1;
  char *va_1;
  char *vb_1;
  int sum3_1;
  int sum2_1;
  int sum1_1;
  int sum0_1;
  int n_2;
  int n_1;
  int n;
  int k;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  int sum0 [4];
  char *va;
  char *vb;
  int j_1;
  float *output3;
  float *output2;
  float *output1;
  float *output0;
  float scale_dequant3;
  float scale_dequant2;
  float scale_dequant1;
  float scale_dequant0;
  float bias3;
  float bias2;
  float bias1;
  float bias0;
  int i_3;
  int pp_1;
  int remain_outch_start_1;
  int nn_outch_1;
  int q_3;
  char *ktmp_1;
  char *k0_1;
  int p_2;
  int q_2;
  char *ktmp;
  char *k3;
  char *k2;
  char *k1;
  char *k0;
  int p_1;
  int pp;
  int remain_outch_start;
  int nn_outch;
  Mat kernel_tm;
  int q_1;
  char *tmpptr_1;
  char *img0_1;
  int i_2;
  int q;
  char *tmpptr;
  char *img3;
  char *img2;
  char *img1;
  char *img0;
  int i_1;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat bottom_tm;
  int K;
  int N;
  int out_size;
  int kernel_size;
  int index;
  int col;
  int row;
  int v;
  int u;
  char *input;
  int p;
  int j;
  int i;
  int retID;
  char *ret;
  Mat bottom_im2row;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  Allocator *in_stack_fffffffffffff678;
  size_t in_stack_fffffffffffff680;
  undefined8 in_stack_fffffffffffff688;
  Mat *in_stack_fffffffffffff690;
  Mat *in_stack_fffffffffffff6a0;
  Mat *in_stack_fffffffffffff6a8;
  float local_94c;
  float local_8f0;
  float local_8ec;
  float local_8e8;
  float local_8e4;
  int local_884;
  Mat local_880;
  char *local_838;
  Mat local_830;
  char *local_7e8;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  int local_7cc;
  int local_7c8 [6];
  Mat local_7b0;
  char *local_768;
  Mat local_760;
  Mat *local_718;
  int local_70c;
  value_type local_708;
  float local_704;
  Mat local_700;
  float *local_6b8;
  int local_6b0;
  int local_6ac;
  Mat local_6a8;
  char *local_660;
  Mat local_658;
  char *local_610;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  int local_5e8 [4];
  int local_5d8 [4];
  int local_5c8 [4];
  int local_5b8 [6];
  Mat local_5a0;
  char *local_558;
  Mat local_550;
  char *local_508;
  int local_4fc;
  Mat local_4f8;
  float *local_4b0;
  Mat local_4a8;
  float *local_460;
  Mat local_458;
  float *local_410;
  Mat local_408;
  float *local_3c0;
  value_type local_3b4;
  value_type local_3b0;
  value_type local_3ac;
  value_type local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  Mat local_380;
  char *local_338;
  char *local_330;
  int local_328;
  int local_324;
  Mat local_320;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_254;
  Mat local_250;
  char *local_208;
  char *local_200;
  int local_1f8;
  int local_1f4;
  Mat local_1f0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  Mat local_f8;
  char *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  char *local_98;
  Mat local_90;
  float *local_48;
  char *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_28 = *(int *)(in_RDI + 0x2c);
  local_2c = *(int *)(in_RDI + 0x38);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x38);
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_40 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(in_stack_00000010);
  Mat::Mat(in_stack_fffffffffffff690,(int)((ulong)in_stack_fffffffffffff688 >> 0x20),
           (int)in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_98 = Mat::operator_cast_to_signed_char_(&local_90);
  local_9c = 0;
  for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
    for (local_a4 = 0; local_a4 < local_30; local_a4 = local_a4 + 1) {
      for (local_a8 = 0; local_a8 < local_2c; local_a8 = local_a8 + 1) {
        Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
        pcVar1 = Mat::operator_cast_to_signed_char_(&local_f8);
        Mat::~Mat((Mat *)0x1d5552);
        for (local_108 = 0; local_108 < local_20; local_108 = local_108 + 1) {
          for (local_10c = 0; local_10c < local_1c; local_10c = local_10c + 1) {
            local_110 = local_108 + local_a0 * in_stack_00000008;
            local_114 = local_10c + local_a4 * local_24;
            local_118 = local_110 * local_28 + local_114;
            local_98[local_9c] = pcVar1[local_118];
            local_9c = local_9c + 1;
          }
        }
        local_b0 = pcVar1;
      }
    }
  }
  local_11c = local_1c * local_20;
  local_120 = local_30 * local_34;
  local_124 = local_30 * local_34;
  local_128 = local_1c * local_20 * local_2c;
  Mat::Mat(in_stack_fffffffffffff690,(int)((ulong)in_stack_fffffffffffff688 >> 0x20),
           (int)in_stack_fffffffffffff688,(int)(in_stack_fffffffffffff680 >> 0x20),
           (size_t)in_stack_fffffffffffff678,(Allocator *)0x1d577a);
  local_174 = local_120 >> 2;
  local_178 = local_174 << 2;
  for (local_17c = 0; local_17c < local_174; local_17c = local_17c + 1) {
    local_180 = local_17c << 2;
    local_188 = Mat::row<signed_char>(&local_90,local_180);
    local_190 = Mat::row<signed_char>(&local_90,local_180 + 1);
    local_198 = Mat::row<signed_char>(&local_90,local_180 + 2);
    local_1a0 = Mat::row<signed_char>(&local_90,local_180 + 3);
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_1f0);
    Mat::~Mat((Mat *)0x1d58db);
    local_1a8 = pcVar1;
    for (local_1f4 = 0; local_1f4 + 1 < local_2c * local_11c; local_1f4 = local_1f4 + 2) {
      *local_1a8 = *local_188;
      local_1a8[1] = local_188[1];
      local_1a8[2] = *local_190;
      local_1a8[3] = local_190[1];
      local_1a8[4] = *local_198;
      local_1a8[5] = local_198[1];
      local_1a8[6] = *local_1a0;
      local_1a8[7] = local_1a0[1];
      local_1a8 = local_1a8 + 8;
      local_188 = local_188 + 2;
      local_190 = local_190 + 2;
      local_198 = local_198 + 2;
      local_1a0 = local_1a0 + 2;
    }
    for (; local_1f4 < local_2c * local_11c; local_1f4 = local_1f4 + 1) {
      *local_1a8 = *local_188;
      local_1a8[1] = *local_190;
      local_1a8[2] = *local_198;
      local_1a8[3] = *local_1a0;
      local_1a8 = local_1a8 + 4;
      local_188 = local_188 + 1;
      local_190 = local_190 + 1;
      local_198 = local_198 + 1;
      local_1a0 = local_1a0 + 1;
    }
  }
  for (local_1f8 = local_178; local_1f8 < local_120; local_1f8 = local_1f8 + 1) {
    local_200 = Mat::row<signed_char>(&local_90,local_1f8);
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_250);
    Mat::~Mat((Mat *)0x1d5c02);
    local_208 = pcVar1;
    for (local_254 = 0; local_254 + 1 < local_2c * local_11c; local_254 = local_254 + 2) {
      *local_208 = *local_200;
      local_208[1] = local_200[1];
      local_208 = local_208 + 2;
      local_200 = local_200 + 2;
    }
    for (; local_254 < local_2c * local_11c; local_254 = local_254 + 1) {
      *local_208 = *local_200;
      local_208 = local_208 + 1;
      local_200 = local_200 + 1;
    }
  }
  Mat::Mat(in_stack_fffffffffffff690,(int)((ulong)in_stack_fffffffffffff688 >> 0x20),
           (int)in_stack_fffffffffffff688,(int)(in_stack_fffffffffffff680 >> 0x20),
           (size_t)in_stack_fffffffffffff678,(Allocator *)0x1d5d74);
  local_2a4 = local_38 >> 2;
  local_2a8 = local_2a4 << 2;
  for (local_2ac = 0; local_2ac < local_2a4; local_2ac = local_2ac + 1) {
    local_2b0 = local_2ac * 4;
    local_2b8 = local_40 + local_2b0 * local_2c * local_11c;
    local_2c0 = local_40 + (local_2b0 + 1) * local_2c * local_11c;
    local_2c8 = local_40 + (local_2b0 + 2) * local_2c * local_11c;
    local_2d0 = local_40 + (local_2b0 + 3) * local_2c * local_11c;
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_320);
    Mat::~Mat((Mat *)0x1d5ef7);
    local_2d8 = pcVar1;
    for (local_324 = 0; local_324 + 1 < local_2c * local_11c; local_324 = local_324 + 2) {
      *local_2d8 = *local_2b8;
      local_2d8[1] = local_2b8[1];
      local_2d8[2] = *local_2c0;
      local_2d8[3] = local_2c0[1];
      local_2d8[4] = *local_2c8;
      local_2d8[5] = local_2c8[1];
      local_2d8[6] = *local_2d0;
      local_2d8[7] = local_2d0[1];
      local_2d8 = local_2d8 + 8;
      local_2b8 = local_2b8 + 2;
      local_2c0 = local_2c0 + 2;
      local_2c8 = local_2c8 + 2;
      local_2d0 = local_2d0 + 2;
    }
    for (; local_324 < local_2c * local_11c; local_324 = local_324 + 1) {
      *local_2d8 = *local_2b8;
      local_2d8[1] = *local_2c0;
      local_2d8[2] = *local_2c8;
      local_2d8[3] = *local_2d0;
      local_2d8 = local_2d8 + 4;
      local_2b8 = local_2b8 + 1;
      local_2c0 = local_2c0 + 1;
      local_2c8 = local_2c8 + 1;
      local_2d0 = local_2d0 + 1;
    }
  }
  for (local_328 = local_2a8; local_328 < local_38; local_328 = local_328 + 1) {
    local_330 = local_40 + local_328 * local_2c * local_11c;
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pcVar1 = Mat::operator_cast_to_signed_char_(&local_380);
    Mat::~Mat((Mat *)0x1d6221);
    local_338 = pcVar1;
    for (local_384 = 0; local_384 + 1 < local_2c * local_11c; local_384 = local_384 + 2) {
      *local_338 = *local_330;
      local_338[1] = local_330[1];
      local_338 = local_338 + 2;
      local_330 = local_330 + 2;
    }
    for (; local_384 < local_2c * local_11c; local_384 = local_384 + 1) {
      *local_338 = *local_330;
      local_338 = local_338 + 1;
      local_330 = local_330 + 1;
    }
  }
  local_388 = local_38 >> 2;
  local_38c = local_388 << 2;
  for (local_390 = 0; local_390 < local_388; local_390 = local_390 + 1) {
    local_394 = local_390 * 4;
    if (local_48 == (float *)0x0) {
      local_8e4 = 0.0;
    }
    else {
      local_8e4 = local_48[local_394];
    }
    local_398 = local_8e4;
    if (local_48 == (float *)0x0) {
      local_8e8 = 0.0;
    }
    else {
      local_8e8 = local_48[local_394 + 1];
    }
    local_39c = local_8e8;
    if (local_48 == (float *)0x0) {
      local_8ec = 0.0;
    }
    else {
      local_8ec = local_48[local_394 + 2];
    }
    local_3a0 = local_8ec;
    if (local_48 == (float *)0x0) {
      local_8f0 = 0.0;
    }
    else {
      local_8f0 = local_48[local_394 + 3];
    }
    local_3a4 = local_8f0;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)local_394);
    local_3a8 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_394 + 1));
    local_3ac = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_394 + 2));
    local_3b0 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)(local_394 + 3));
    local_3b4 = *pvVar2;
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_408);
    Mat::~Mat((Mat *)0x1d65bf);
    local_3c0 = pfVar3;
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_458);
    Mat::~Mat((Mat *)0x1d6613);
    local_410 = pfVar3;
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_4a8);
    Mat::~Mat((Mat *)0x1d6668);
    local_460 = pfVar3;
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_4f8);
    Mat::~Mat((Mat *)0x1d66ba);
    local_4b0 = pfVar3;
    for (local_4fc = 0; local_4fc + 3 < local_124; local_4fc = local_4fc + 4) {
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_550);
      Mat::~Mat((Mat *)0x1d6735);
      local_508 = pcVar1;
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_5a0);
      Mat::~Mat((Mat *)0x1d678c);
      local_558 = pcVar1;
      memset(local_5b8,0,0x10);
      memset(local_5c8,0,0x10);
      memset(local_5d8,0,0x10);
      memset(local_5e8,0,0x10);
      for (local_5ec = 0; local_5ec + 1 < local_128; local_5ec = local_5ec + 2) {
        for (local_5f0 = 0; local_5f0 < 4; local_5f0 = local_5f0 + 1) {
          local_5b8[local_5f0] =
               (int)*local_558 * (int)local_508[local_5f0 << 1] + local_5b8[local_5f0];
          local_5b8[local_5f0] =
               (int)local_558[1] * (int)local_508[local_5f0 * 2 + 1] + local_5b8[local_5f0];
          local_5c8[local_5f0] =
               (int)local_558[2] * (int)local_508[local_5f0 << 1] + local_5c8[local_5f0];
          local_5c8[local_5f0] =
               (int)local_558[3] * (int)local_508[local_5f0 * 2 + 1] + local_5c8[local_5f0];
          local_5d8[local_5f0] =
               (int)local_558[4] * (int)local_508[local_5f0 << 1] + local_5d8[local_5f0];
          local_5d8[local_5f0] =
               (int)local_558[5] * (int)local_508[local_5f0 * 2 + 1] + local_5d8[local_5f0];
          local_5e8[local_5f0] =
               (int)local_558[6] * (int)local_508[local_5f0 << 1] + local_5e8[local_5f0];
          local_5e8[local_5f0] =
               (int)local_558[7] * (int)local_508[local_5f0 * 2 + 1] + local_5e8[local_5f0];
        }
        local_558 = local_558 + 8;
        local_508 = local_508 + 8;
      }
      for (; local_5ec < local_128; local_5ec = local_5ec + 1) {
        for (local_5f4 = 0; local_5f4 < 4; local_5f4 = local_5f4 + 1) {
          local_5b8[local_5f4] = (int)*local_558 * (int)local_508[local_5f4] + local_5b8[local_5f4];
          local_5c8[local_5f4] =
               (int)local_558[1] * (int)local_508[local_5f4] + local_5c8[local_5f4];
          local_5d8[local_5f4] =
               (int)local_558[2] * (int)local_508[local_5f4] + local_5d8[local_5f4];
          local_5e8[local_5f4] =
               (int)local_558[3] * (int)local_508[local_5f4] + local_5e8[local_5f4];
        }
        local_558 = local_558 + 4;
        local_508 = local_508 + 4;
      }
      for (local_5f8 = 0; local_5f8 < 4; local_5f8 = local_5f8 + 1) {
        local_3c0[local_5f8] = (float)local_5b8[local_5f8] * local_3a8 + local_398;
        local_410[local_5f8] = (float)local_5c8[local_5f8] * local_3ac + local_39c;
        local_460[local_5f8] = (float)local_5d8[local_5f8] * local_3b0 + local_3a0;
        local_4b0[local_5f8] = (float)local_5e8[local_5f8] * local_3b4 + local_3a4;
      }
      local_3c0 = local_3c0 + 4;
      local_410 = local_410 + 4;
      local_460 = local_460 + 4;
      local_4b0 = local_4b0 + 4;
    }
    for (; local_4fc < local_124; local_4fc = local_4fc + 1) {
      local_5fc = 0;
      local_600 = 0;
      local_604 = 0;
      local_608 = 0;
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_658);
      Mat::~Mat((Mat *)0x1d6e77);
      local_610 = pcVar1;
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_6a8);
      Mat::~Mat((Mat *)0x1d6ece);
      local_660 = pcVar1;
      for (local_6ac = 0; local_6ac + 1 < local_128; local_6ac = local_6ac + 2) {
        local_5fc = (int)local_660[1] * (int)local_610[1] +
                    (int)*local_660 * (int)*local_610 + local_5fc;
        local_600 = (int)local_660[3] * (int)local_610[1] +
                    (int)local_660[2] * (int)*local_610 + local_600;
        local_604 = (int)local_660[5] * (int)local_610[1] +
                    (int)local_660[4] * (int)*local_610 + local_604;
        local_608 = (int)local_660[7] * (int)local_610[1] +
                    (int)local_660[6] * (int)*local_610 + local_608;
        local_660 = local_660 + 8;
        local_610 = local_610 + 2;
      }
      for (; local_6ac < local_128; local_6ac = local_6ac + 1) {
        local_5fc = (int)*local_660 * (int)*local_610 + local_5fc;
        local_600 = (int)local_660[1] * (int)*local_610 + local_600;
        local_604 = (int)local_660[2] * (int)*local_610 + local_604;
        local_608 = (int)local_660[3] * (int)*local_610 + local_608;
        local_660 = local_660 + 4;
        local_610 = local_610 + 1;
      }
      *local_3c0 = (float)local_5fc * local_3a8 + local_398;
      *local_410 = (float)local_600 * local_3ac + local_39c;
      *local_460 = (float)local_604 * local_3b0 + local_3a0;
      *local_4b0 = (float)local_608 * local_3b4 + local_3a4;
      local_3c0 = local_3c0 + 1;
      local_410 = local_410 + 1;
      local_460 = local_460 + 1;
      local_4b0 = local_4b0 + 1;
    }
  }
  for (local_6b0 = local_38c; local_6b0 < local_38; local_6b0 = local_6b0 + 1) {
    Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_700);
    Mat::~Mat((Mat *)0x1d72ec);
    if (local_48 == (float *)0x0) {
      local_94c = 0.0;
    }
    else {
      local_94c = local_48[local_6b0];
    }
    local_704 = local_94c;
    local_6b8 = pfVar3;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (in_stack_00000018,(long)local_6b0);
    local_708 = *pvVar2;
    for (local_70c = 0; local_70c + 3 < local_124; local_70c = local_70c + 4) {
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      in_stack_fffffffffffff6a0 = &local_760;
      in_stack_fffffffffffff6a8 =
           (Mat *)Mat::operator_cast_to_signed_char_(in_stack_fffffffffffff6a0);
      Mat::~Mat((Mat *)0x1d73cb);
      local_718 = in_stack_fffffffffffff6a8;
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_7b0);
      Mat::~Mat((Mat *)0x1d742d);
      local_768 = pcVar1;
      memset(local_7c8,0,0x10);
      for (local_7cc = 0; local_7cc + 1 < local_128; local_7cc = local_7cc + 2) {
        for (local_7d0 = 0; local_7d0 < 4; local_7d0 = local_7d0 + 1) {
          local_7c8[local_7d0] =
               (int)*local_768 * (int)*(char *)((long)&local_718->data + (long)(local_7d0 << 1)) +
               local_7c8[local_7d0];
          local_7c8[local_7d0] =
               (int)local_768[1] *
               (int)*(char *)((long)&local_718->data + (long)(local_7d0 * 2 + 1)) +
               local_7c8[local_7d0];
        }
        local_768 = local_768 + 2;
        local_718 = (Mat *)&local_718->refcount;
      }
      for (; local_7cc < local_128; local_7cc = local_7cc + 1) {
        for (local_7d4 = 0; local_7d4 < 4; local_7d4 = local_7d4 + 1) {
          local_7c8[local_7d4] =
               (int)*local_768 * (int)*(char *)((long)&local_718->data + (long)local_7d4) +
               local_7c8[local_7d4];
        }
        local_768 = local_768 + 1;
        local_718 = (Mat *)((long)&local_718->data + 4);
      }
      for (local_7d8 = 0; local_7d8 < 4; local_7d8 = local_7d8 + 1) {
        local_6b8[local_7d8] = (float)local_7c8[local_7d8] * local_708 + local_704;
      }
      local_6b8 = local_6b8 + 4;
    }
    for (; local_70c < local_124; local_70c = local_70c + 1) {
      local_7dc = 0;
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_830);
      Mat::~Mat((Mat *)0x1d7735);
      local_7e8 = pcVar1;
      Mat::channel(in_stack_fffffffffffff6a8,(int)((ulong)in_stack_fffffffffffff6a0 >> 0x20));
      pcVar1 = Mat::operator_cast_to_signed_char_(&local_880);
      Mat::~Mat((Mat *)0x1d7797);
      local_838 = pcVar1;
      for (local_884 = 0; local_884 < local_128; local_884 = local_884 + 1) {
        local_7dc = (int)*local_838 * (int)*local_7e8 + local_7dc;
        local_838 = local_838 + 1;
        local_7e8 = local_7e8 + 1;
      }
      *local_6b8 = (float)local_7dc * local_708 + local_704;
      local_6b8 = local_6b8 + 1;
    }
  }
  Mat::~Mat((Mat *)0x1d7897);
  Mat::~Mat((Mat *)0x1d78a4);
  Mat::~Mat((Mat *)0x1d78b1);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel,
        const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat& _bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h * kernel_w * inch, outw * outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                for (int p = 0; p < inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh;                // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i + 1);
            const signed char* img2 = bottom_im2row.row<signed char>(i + 2);
            const signed char* img3 = bottom_im2row.row<signed char>(i + 3);

            signed char* tmpptr = bottom_tm.channel(i / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4 * kernel_size, inch, outch / 4 + outch % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;
            const signed char* k1 = kernel + (p + 1) * inch * kernel_size;
            const signed char* k2 = kernel + (p + 2) * inch * kernel_size;
            const signed char* k3 = kernel + (p + 3) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q += 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4 + p % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i + 1] : 0.f;
            const float bias2 = bias ? bias[i + 2] : 0.f;
            const float bias3 = bias ? bias[i + 3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i + 1];
            const float scale_dequant2 = scale_dequant[i + 2];
            const float scale_dequant3 = scale_dequant[i + 3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i + 1);
            float* output2 = top_blob.channel(i + 2);
            float* output3 = top_blob.channel(i + 3);

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4);

                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2 * n]; // k0
                        sum0[n] += (int)va[1] * vb[2 * n + 1];

                        sum1[n] += (int)va[2] * vb[2 * n]; // k1
                        sum1[n] += (int)va[3] * vb[2 * n + 1];

                        sum2[n] += (int)va[4] * vb[2 * n]; // k2
                        sum2[n] += (int)va[5] * vb[2 * n + 1];

                        sum3[n] += (int)va[6] * vb[2 * n]; // k3
                        sum3[n] += (int)va[7] * vb[2 * n + 1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4);

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k < K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);
                int sum[4] = {0};

                int k = 0;
                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2 * n];
                        sum[n] += (int)va[1] * vb[2 * n + 1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j < N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);

                for (int k = 0; k < K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}